

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlWalkValidateList(void *data,void *user)

{
  xmlValidCtxtPtr ctxt;
  xmlChar *cur;
  long lVar1;
  xmlAttrPtr pxVar2;
  xmlValidateMemoPtr memo;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *local_38;
  
  if (data == (void *)0x0) {
    return 1;
  }
  ctxt = *user;
  cur = *(xmlChar **)((long)user + 8);
  lVar1 = *(long *)((long)data + 0x10);
  if (lVar1 == 0) {
    if (*(long *)((long)data + 0x18) == 0) {
      return 1;
    }
    local_38 = xmlStrdup(cur);
    if (local_38 == (byte *)0x0) {
      xmlVErrMemory(ctxt);
      return 1;
    }
    bVar3 = *local_38;
    pbVar4 = local_38;
    while (pbVar5 = pbVar4, bVar3 != 0) {
      while ((0x20 < bVar3 || ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))) {
        bVar3 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
      }
      *pbVar5 = 0;
      pxVar2 = xmlGetID(ctxt->doc,pbVar4);
      if (pxVar2 == (xmlAttrPtr)0x0) {
        xmlErrValidNodeNr(ctxt,(xmlNodePtr)0x0,XML_DTD_UNKNOWN_ID,
                          "attribute %s line %d references an unknown ID \"%s\"\n",
                          *(xmlChar **)((long)data + 0x18),*(int *)((long)data + 0x20),pbVar4);
        ctxt->valid = 0;
      }
      if (bVar3 == 0) break;
      *pbVar5 = bVar3;
      while ((pbVar4 = pbVar5, bVar3 < 0x21 && ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0)))
      {
        bVar3 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
      }
    }
LAB_0015658b:
    (*xmlFree)(local_38);
  }
  else {
    if (*(int *)(lVar1 + 0x50) == 4) {
      local_38 = xmlStrdup(cur);
      if (local_38 != (byte *)0x0) {
        bVar3 = *local_38;
        pbVar4 = local_38;
        while (pbVar5 = pbVar4, bVar3 != 0) {
          while ((0x20 < bVar3 || ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))) {
            bVar3 = pbVar5[1];
            pbVar5 = pbVar5 + 1;
          }
          *pbVar5 = 0;
          pxVar2 = xmlGetID(ctxt->doc,pbVar4);
          if (pxVar2 == (xmlAttrPtr)0x0) {
            xmlErrValidNode(ctxt,*(xmlNodePtr *)(lVar1 + 0x28),XML_DTD_UNKNOWN_ID,
                            "IDREFS attribute %s references an unknown ID \"%s\"\n",
                            *(xmlChar **)(lVar1 + 0x10),pbVar4,(xmlChar *)0x0);
            ctxt->valid = 0;
          }
          if (bVar3 == 0) break;
          *pbVar5 = bVar3;
          while ((pbVar4 = pbVar5, bVar3 < 0x21 &&
                 ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0))) {
            bVar3 = pbVar5[1];
            pbVar5 = pbVar5 + 1;
          }
        }
        goto LAB_0015658b;
      }
      xmlVErrMemory(ctxt);
    }
    else {
      if (*(int *)(lVar1 + 0x50) != 3) {
        return 1;
      }
      pxVar2 = xmlGetID(ctxt->doc,cur);
      if (pxVar2 != (xmlAttrPtr)0x0) {
        return 1;
      }
      xmlErrValidNode(ctxt,*(xmlNodePtr *)(lVar1 + 0x28),XML_DTD_UNKNOWN_ID,
                      "IDREF attribute %s references an unknown ID \"%s\"\n",
                      *(xmlChar **)(lVar1 + 0x10),cur,(xmlChar *)0x0);
    }
    ctxt->valid = 0;
  }
  return 1;
}

Assistant:

static void
xmlValidateRef(xmlRefPtr ref, xmlValidCtxtPtr ctxt,
	                   const xmlChar *name) {
    xmlAttrPtr id;
    xmlAttrPtr attr;

    if (ref == NULL)
	return;
    if ((ref->attr == NULL) && (ref->name == NULL))
	return;
    attr = ref->attr;
    if (attr == NULL) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
            xmlVErrMemory(ctxt);
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNodeNr(ctxt, NULL, XML_DTD_UNKNOWN_ID,
	   "attribute %s line %d references an unknown ID \"%s\"\n",
		       ref->name, ref->lineno, str);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    } else if (attr->atype == XML_ATTRIBUTE_IDREF) {
	id = xmlGetID(ctxt->doc, name);
	if (id == NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREF attribute %s references an unknown ID \"%s\"\n",
		   attr->name, name, NULL);
	    ctxt->valid = 0;
	}
    } else if (attr->atype == XML_ATTRIBUTE_IDREFS) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
	    xmlVErrMemory(ctxt);
	    ctxt->valid = 0;
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREFS attribute %s references an unknown ID \"%s\"\n",
			     attr->name, str, NULL);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    }
}